

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

Vec_Int_t * If_ManCollectMappingInt(If_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  If_Obj_t *pObj_00;
  If_Cut_t *pCut;
  int *piVar2;
  int *ppLeaves;
  int local_30;
  int nLeaves;
  int k;
  int i;
  If_Obj_t *pObj;
  If_Cut_t *pCutBest;
  Vec_Int_t *vOrder;
  If_Man_t *p_local;
  
  If_ManMarkMapping(p);
  iVar1 = If_ManObjNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (nLeaves = 0; iVar1 = Vec_PtrSize(p->vObjs), nLeaves < iVar1; nLeaves = nLeaves + 1) {
    pObj_00 = (If_Obj_t *)Vec_PtrEntry(p->vObjs,nLeaves);
    iVar1 = If_ObjIsAnd(pObj_00);
    if ((iVar1 != 0) && (pObj_00->nRefs != 0)) {
      pCut = If_ObjCutBest(pObj_00);
      iVar1 = If_CutLeaveNum(pCut);
      piVar2 = If_CutLeaves(pCut);
      Vec_IntPush(p_00,iVar1);
      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
        Vec_IntPush(p_00,piVar2[local_30]);
      }
      Vec_IntPush(p_00,pObj_00->Id);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * If_ManCollectMappingInt( If_Man_t * p )
{
    Vec_Int_t * vOrder;
    If_Cut_t * pCutBest;
    If_Obj_t * pObj;
    int i, k, nLeaves, * ppLeaves;
    If_ManMarkMapping( p );
    vOrder = Vec_IntAlloc( If_ManObjNum(p) );
    If_ManForEachObj( p, pObj, i )
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            pCutBest = If_ObjCutBest( pObj );
            nLeaves  = If_CutLeaveNum( pCutBest ); 
            ppLeaves = If_CutLeaves( pCutBest );
            // save the number of leaves, the leaves, and finally, the root
            Vec_IntPush( vOrder, nLeaves );
            for ( k = 0; k < nLeaves; k++ )
                Vec_IntPush( vOrder, ppLeaves[k] );
            Vec_IntPush( vOrder, pObj->Id );
        }
    return vOrder;
}